

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O2

int32_t spvOpcodeIsSpecConstant(Op opcode)

{
  if ((4 < opcode - OpSpecConstantTrue) && (opcode != OpSpecConstantCompositeReplicateEXT)) {
    return 0;
  }
  return 1;
}

Assistant:

int32_t spvOpcodeIsSpecConstant(const spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpSpecConstantTrue:
    case spv::Op::OpSpecConstantFalse:
    case spv::Op::OpSpecConstant:
    case spv::Op::OpSpecConstantComposite:
    case spv::Op::OpSpecConstantCompositeReplicateEXT:
    case spv::Op::OpSpecConstantOp:
      return true;
    default:
      return false;
  }
}